

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void read_simpletiled_instance(xml_node<char> *node,string *current_dir)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  undefined4 uVar5;
  int iVar6;
  int seed;
  int *piVar7;
  long lVar8;
  ostream *poVar9;
  long *plVar10;
  xml_node<char> *pxVar11;
  iterator iVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  undefined8 uVar15;
  size_type *psVar16;
  long *plVar17;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *p_Var18;
  uint uVar19;
  int iVar20;
  bool bVar21;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  optional<Array2D<Color>_> success;
  string name;
  vector<char,_std::allocator<char>_> buffer;
  string subset;
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  neighbors_ids;
  vector<Tile<Color>,_std::allocator<Tile<Color>_>_> tiles;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  tiles_id;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
  tiles_map;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  neighbors;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
  tile;
  ifstream config_file;
  xml_document<char> data_document;
  anon_union_32_2_27af336a_for_optional_storage_base<Array2D<Color>,_false>_2 aStack_106c8;
  uint uStack_106a8;
  xml_node<char> *pxStack_106a0;
  string sStack_10698;
  vector<char,_std::allocator<char>_> vStack_10678;
  string *psStack_10660;
  long lStack_10658;
  long lStack_10650;
  long *plStack_10648;
  long lStack_10640;
  long lStack_10638;
  long lStack_10630;
  long *plStack_10628;
  long lStack_10620;
  long lStack_10618;
  long lStack_10610;
  long *plStack_10608;
  long lStack_10600;
  long lStack_105f8;
  long lStack_105f0;
  string sStack_105e8;
  vector<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
  vStack_105c8;
  vector<Tile<Color>,_std::allocator<Tile<Color>_>_> vStack_105a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_10588;
  undefined1 auStack_10550 [56];
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  vStack_10518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10500;
  undefined1 auStack_104e0 [16];
  undefined1 auStack_104d0 [16];
  undefined1 auStack_104c0 [16];
  undefined1 auStack_104b0 [40];
  pointer pdStack_10488;
  Wave WStack_10470;
  vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
  vStack_10378;
  pointer ptStack_10350;
  pointer paStack_10328;
  string asStack_10310 [7];
  undefined8 auStack_10228 [36];
  undefined1 auStack_10108 [32];
  xml_node<char> *pxStack_100e8;
  char *pcStack_100e0;
  char *pcStack_100d8;
  undefined4 uStack_100d0;
  undefined4 uStack_100cc;
  undefined4 uStack_100c8;
  undefined8 uStack_100c4;
  xml_node<char> *pxStack_100b8;
  xml_node<char> *pxStack_100b0;
  xml_attribute<char> *pxStack_100a8;
  xml_attribute<char> *pxStack_100a0;
  xml_node<char> *pxStack_10098;
  xml_node<char> *pxStack_10090;
  char *pcStack_10088;
  size_t sStack_10080;
  memory_pool<char> mStack_10078;
  
  pcVar1 = auStack_10108 + 0x10;
  psStack_10660 = current_dir;
  auStack_10108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_10108,"name","");
  rapidxml::get_attribute(&sStack_10698,node,(string *)auStack_10108);
  if ((char *)auStack_10108._0_8_ != pcVar1) {
    operator_delete((void *)auStack_10108._0_8_);
  }
  auStack_10108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_10108,"subset","");
  paVar2 = &asStack_10310[0].field_2;
  asStack_10310[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)asStack_10310,"tiles","");
  rapidxml::get_attribute(&sStack_105e8,node,(string *)auStack_10108,asStack_10310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)asStack_10310[0]._M_dataplus._M_p != paVar2) {
    operator_delete(asStack_10310[0]._M_dataplus._M_p);
  }
  if ((char *)auStack_10108._0_8_ != pcVar1) {
    operator_delete((void *)auStack_10108._0_8_);
  }
  asStack_10310[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)asStack_10310,"periodic","");
  auStack_104e0._0_8_ = auStack_104d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_104e0,"False","");
  rapidxml::get_attribute((string *)auStack_10108,node,asStack_10310,(string *)auStack_104e0);
  iVar6 = std::__cxx11::string::compare((char *)auStack_10108);
  if ((char *)auStack_10108._0_8_ != pcVar1) {
    operator_delete((void *)auStack_10108._0_8_);
  }
  if ((undefined1 *)auStack_104e0._0_8_ != auStack_104d0) {
    operator_delete((void *)auStack_104e0._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)asStack_10310[0]._M_dataplus._M_p != paVar2) {
    operator_delete(asStack_10310[0]._M_dataplus._M_p);
  }
  asStack_10310[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)asStack_10310,"width","");
  auStack_104e0._0_8_ = auStack_104d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_104e0,"48","");
  rapidxml::get_attribute((string *)auStack_10108,node,asStack_10310,(string *)auStack_104e0);
  uVar15 = auStack_10108._0_8_;
  piVar7 = __errno_location();
  iVar20 = *piVar7;
  *piVar7 = 0;
  lVar8 = strtol((char *)uVar15,(char **)auStack_10550,10);
  if (auStack_10550._0_8_ == uVar15) {
    std::__throw_invalid_argument("stoi");
LAB_0010bf85:
    std::__throw_out_of_range("stoi");
LAB_0010bf91:
    std::__throw_invalid_argument("stoi");
LAB_0010bf9d:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar8 != lVar8) || (*piVar7 == 0x22)) goto LAB_0010bf85;
    if (*piVar7 == 0) {
      *piVar7 = iVar20;
    }
    lStack_10650 = lVar8;
    if ((char *)auStack_10108._0_8_ != pcVar1) {
      operator_delete((void *)auStack_10108._0_8_);
    }
    if ((undefined1 *)auStack_104e0._0_8_ != auStack_104d0) {
      operator_delete((void *)auStack_104e0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)asStack_10310[0]._M_dataplus._M_p != &asStack_10310[0].field_2) {
      operator_delete(asStack_10310[0]._M_dataplus._M_p);
    }
    asStack_10310[0]._M_dataplus._M_p = (pointer)&asStack_10310[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)asStack_10310,"height","");
    auStack_104e0._0_8_ = auStack_104d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_104e0,"48","");
    rapidxml::get_attribute((string *)auStack_10108,node,asStack_10310,(string *)auStack_104e0);
    uVar15 = auStack_10108._0_8_;
    iVar20 = *piVar7;
    *piVar7 = 0;
    lVar8 = strtol((char *)auStack_10108._0_8_,(char **)auStack_10550,10);
    if (auStack_10550._0_8_ == uVar15) goto LAB_0010bf91;
    if ((lVar8 - 0x80000000U < 0xffffffff00000000) || (*piVar7 == 0x22)) goto LAB_0010bf9d;
    if (*piVar7 == 0) {
      *piVar7 = iVar20;
    }
    lStack_10658 = lVar8;
    if ((char *)auStack_10108._0_8_ != pcVar1) {
      operator_delete((void *)auStack_10108._0_8_);
    }
    if ((undefined1 *)auStack_104e0._0_8_ != auStack_104d0) {
      operator_delete((void *)auStack_104e0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)asStack_10310[0]._M_dataplus._M_p != &asStack_10310[0].field_2) {
      operator_delete(asStack_10310[0]._M_dataplus._M_p);
    }
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,sStack_10698._M_dataplus._M_p,
                        sStack_10698._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,sStack_105e8._M_dataplus._M_p,sStack_105e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," started!",9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_104e0,"samples/",&sStack_10698);
    plVar10 = (long *)std::__cxx11::string::append(auStack_104e0);
    psVar16 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar16) {
      auStack_10108._16_8_ = *psVar16;
      auStack_10108._24_8_ = plVar10[3];
      auStack_10108._0_8_ = pcVar1;
    }
    else {
      auStack_10108._16_8_ = *psVar16;
      auStack_10108._0_8_ = (size_type *)*plVar10;
    }
    auStack_10108._8_8_ = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    std::ifstream::ifstream(asStack_10310,(string *)auStack_10108,_S_in);
    if ((char *)auStack_10108._0_8_ != pcVar1) {
      operator_delete((void *)auStack_10108._0_8_);
    }
    if ((undefined1 *)auStack_104e0._0_8_ != auStack_104d0) {
      operator_delete((void *)auStack_104e0._0_8_);
    }
    __first._8_8_ = 0xffffffff;
    __first._M_sbuf =
         *(streambuf_type **)
          ((long)auStack_10228 + *(long *)(asStack_10310[0]._M_dataplus._M_p + -0x18));
    std::vector<char,std::allocator<char>>::
    vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((vector<char,std::allocator<char>> *)&vStack_10678,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
               (allocator_type *)auStack_10108);
    auStack_10108._0_8_ = auStack_10108._0_8_ & 0xffffffffffffff00;
    if (vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (&vStack_10678,
                 (iterator)
                 vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,auStack_10108);
    }
    else {
      *vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish = '\0';
      vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    mStack_10078.m_end = (char *)&mStack_10078.m_alloc_func;
    pcStack_10088 = (char *)0x0;
    sStack_10080 = 0;
    pxStack_10098 = (xml_node<char> *)0x0;
    pxStack_10090 = (xml_node<char> *)0x0;
    pxStack_100a8 = (xml_attribute<char> *)0x0;
    pxStack_100a0 = (xml_attribute<char> *)0x0;
    pxStack_100b8 = (xml_node<char> *)0x0;
    pxStack_100b0 = (xml_node<char> *)0x0;
    mStack_10078.m_begin = mStack_10078.m_static_memory;
    mStack_10078.m_alloc_func = (alloc_func *)0x0;
    mStack_10078.m_free_func = (free_func *)0x0;
    auStack_10108._0_8_ = (char *)0x0;
    auStack_10108._8_8_ = (char *)0x0;
    auStack_10108._16_8_ = 0;
    auStack_10108._24_8_ = 0;
    pxStack_100e8 = (xml_node<char> *)0x0;
    pcStack_100e0 = (char *)0x0;
    pcStack_100d8 = (char *)0x0;
    uStack_100d0 = 0;
    uStack_100cc = 0;
    uStack_100c8 = 0;
    uStack_100c4 = 0;
    mStack_10078.m_nullstr = (char *)0x0;
    mStack_10078.m_xmlns_xml = (char *)0x0;
    mStack_10078.m_xmlns_xmlns = (char *)0x0;
    mStack_10078.m_ptr = mStack_10078.m_begin;
    rapidxml::xml_document<char>::parse<0>
              ((xml_document<char> *)auStack_10108,
               vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,(xml_document<char> *)0x0);
    pxVar11 = rapidxml::xml_node<char>::first_node
                        ((xml_node<char> *)auStack_10108,"set",(char *)0x0,0,0,true);
    auStack_10550._0_8_ = auStack_10550 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)auStack_10550,"size","");
    pxStack_106a0 = pxVar11;
    rapidxml::get_attribute((string *)auStack_104e0,pxVar11,(string *)auStack_10550);
    uVar15 = auStack_104e0._0_8_;
    iVar20 = *piVar7;
    *piVar7 = 0;
    lVar8 = strtol((char *)auStack_104e0._0_8_,(char **)&_Stack_10588,10);
    if (_Stack_10588._M_buckets != (__buckets_ptr)uVar15) {
      if ((0xfffffffeffffffff < lVar8 - 0x80000000U) && (*piVar7 != 0x22)) {
        if (*piVar7 == 0) {
          *piVar7 = iVar20;
        }
        if ((undefined1 *)auStack_104e0._0_8_ != auStack_104d0) {
          operator_delete((void *)auStack_104e0._0_8_);
        }
        pxVar11 = pxStack_106a0;
        if ((undefined1 *)auStack_10550._0_8_ != auStack_10550 + 0x10) {
          operator_delete((void *)auStack_10550._0_8_);
        }
        pcVar3 = (psStack_10660->_M_dataplus)._M_p;
        _Stack_10588._M_buckets = &_Stack_10588._M_before_begin._M_nxt;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&_Stack_10588,pcVar3,pcVar3 + psStack_10660->_M_string_length);
        std::__cxx11::string::append((char *)&_Stack_10588);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&_Stack_10588,(ulong)sStack_10698._M_dataplus._M_p);
        psVar16 = (size_type *)(plVar10 + 2);
        if ((size_type *)*plVar10 == psVar16) {
          auStack_104d0._0_8_ = *psVar16;
          auStack_104d0._8_8_ = plVar10[3];
          auStack_104e0._0_8_ = auStack_104d0;
        }
        else {
          auStack_104d0._0_8_ = *psVar16;
          auStack_104e0._0_8_ = (size_type *)*plVar10;
        }
        auStack_104e0._8_8_ = plVar10[1];
        *plVar10 = (long)psVar16;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        read_tiles((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>_>
                    *)auStack_10550,pxVar11,(string *)auStack_104e0,&sStack_105e8,(uint)lVar8);
        if ((undefined1 *)auStack_104e0._0_8_ != auStack_104d0) {
          operator_delete((void *)auStack_104e0._0_8_);
        }
        if ((__node_base *)_Stack_10588._M_buckets != &_Stack_10588._M_before_begin) {
          operator_delete(_Stack_10588._M_buckets);
        }
        _Stack_10588._M_buckets = &_Stack_10588._M_single_bucket;
        _Stack_10588._M_bucket_count = 1;
        _Stack_10588._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        _Stack_10588._M_element_count = 0;
        _Stack_10588._M_rehash_policy._M_max_load_factor = 1.0;
        _Stack_10588._M_rehash_policy._M_next_resize = 0;
        _Stack_10588._M_single_bucket = (__node_base_ptr)0x0;
        vStack_105a8.super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_105a8.super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_105a8.super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((long *)auStack_10550._16_8_ != (long *)0x0) {
          uVar19 = 0;
          plVar10 = (long *)auStack_10550._16_8_;
          do {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
            ::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>,_true>
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
                        *)auStack_104e0,
                       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>
                        *)(plVar10 + 1));
            aStack_106c8._0_8_ = (long)&aStack_106c8.m_value + 0x10U;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&aStack_106c8,auStack_104e0._0_8_,
                       (pointer)(auStack_104e0._8_8_ + auStack_104e0._0_8_));
            uStack_106a8 = uVar19;
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_int>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&_Stack_10588,(string *)&aStack_106c8);
            if (aStack_106c8._0_8_ != (long)&aStack_106c8.m_value + 0x10U) {
              operator_delete((void *)aStack_106c8._0_8_);
            }
            std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::push_back
                      (&vStack_105a8,(value_type *)auStack_104c0);
            std::vector<Array2D<Color>,_std::allocator<Array2D<Color>_>_>::~vector
                      ((vector<Array2D<Color>,_std::allocator<Array2D<Color>_>_> *)auStack_104c0);
            if ((undefined1 *)auStack_104e0._0_8_ != auStack_104d0) {
              operator_delete((void *)auStack_104e0._0_8_);
            }
            plVar10 = (long *)*plVar10;
            uVar19 = uVar19 + 1;
          } while (plVar10 != (long *)0x0);
        }
        read_neighbors_abi_cxx11_(&vStack_10518,pxStack_106a0);
        vStack_105c8.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_105c8.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_105c8.
        super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (vStack_10518.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            vStack_10518.
            super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          p_Var18 = &(vStack_10518.
                      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
          ;
          do {
            std::
            _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                           *)auStack_104e0,p_Var18);
            uVar5 = auStack_104c0._8_4_;
            uVar15 = auStack_104e0._0_8_;
            iVar12 = std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&_Stack_10588,(key_type *)auStack_104b0);
            if (iVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                ._M_cur != (__node_type *)0x0) {
              iVar12 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(&_Stack_10588,(key_type *)(auStack_104e0 + 8));
              if (iVar12.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                  ._M_cur != (__node_type *)0x0) {
                pmVar13 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&_Stack_10588,(key_type *)auStack_104b0);
                pmVar14 = std::__detail::
                          _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        *)&_Stack_10588,(key_type *)(auStack_104e0 + 8));
                aStack_106c8._12_4_ = *pmVar13;
                aStack_106c8.m_value.width = *pmVar14;
                aStack_106c8.m_value.height = (uint)(uint)uVar15;
                aStack_106c8._8_4_ = uVar5;
                std::
                vector<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>,std::allocator<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>>>
                ::emplace_back<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>>
                          ((vector<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>,std::allocator<std::tuple<unsigned_int,unsigned_int,unsigned_int,unsigned_int>>>
                            *)&vStack_105c8,
                           (tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int> *)
                           &aStack_106c8);
              }
            }
            if ((pointer)auStack_104b0._0_8_ != (pointer)(auStack_104b0 + 0x10)) {
              operator_delete((void *)auStack_104b0._0_8_);
            }
            if ((undefined1 *)auStack_104e0._8_8_ != auStack_104d0 + 8) {
              operator_delete((void *)auStack_104e0._8_8_);
            }
            p_Var18 = p_Var18 + 1;
          } while (p_Var18 !=
                   &(vStack_10518.
                     super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  );
        }
        iVar20 = 9;
        do {
          seed = get_random_seed();
          aStack_106c8.m_value.height._0_1_ = iVar6 == 0;
          TilingWFC<Color>::TilingWFC
                    ((TilingWFC<Color> *)auStack_104e0,&vStack_105a8,&vStack_105c8,
                     (uint)lStack_10658,(uint)lStack_10650,(TilingWFCOptions *)&aStack_106c8,seed);
          TilingWFC<Color>::run
                    ((optional<Array2D<Color>_> *)&aStack_106c8,(TilingWFC<Color> *)auStack_104e0);
          bVar4 = uStack_106a8._0_1_;
          if (uStack_106a8._0_1_ == true) {
            std::operator+(&bStack_10500,"results/",&sStack_10698);
            plVar10 = (long *)std::__cxx11::string::append((char *)&bStack_10500);
            plStack_10648 = &lStack_10638;
            plVar17 = plVar10 + 2;
            if ((long *)*plVar10 == plVar17) {
              lStack_10638 = *plVar17;
              lStack_10630 = plVar10[3];
            }
            else {
              lStack_10638 = *plVar17;
              plStack_10648 = (long *)*plVar10;
            }
            lStack_10640 = plVar10[1];
            *plVar10 = (long)plVar17;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&plStack_10648,(ulong)sStack_105e8._M_dataplus._M_p
                                        );
            plStack_10628 = &lStack_10618;
            plVar17 = plVar10 + 2;
            if ((long *)*plVar10 == plVar17) {
              lStack_10618 = *plVar17;
              lStack_10610 = plVar10[3];
            }
            else {
              lStack_10618 = *plVar17;
              plStack_10628 = (long *)*plVar10;
            }
            lStack_10620 = plVar10[1];
            *plVar10 = (long)plVar17;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            plVar10 = (long *)std::__cxx11::string::append((char *)&plStack_10628);
            plVar17 = plVar10 + 2;
            if ((long *)*plVar10 == plVar17) {
              lStack_105f8 = *plVar17;
              lStack_105f0 = plVar10[3];
              plStack_10608 = &lStack_105f8;
            }
            else {
              lStack_105f8 = *plVar17;
              plStack_10608 = (long *)*plVar10;
            }
            lStack_10600 = plVar10[1];
            *plVar10 = (long)plVar17;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            stbi_write_png((char *)plStack_10608,aStack_106c8.m_value.width,
                           aStack_106c8.m_value.height,3,
                           (void *)CONCAT44(aStack_106c8._12_4_,aStack_106c8._8_4_),0);
            if (plStack_10608 != &lStack_105f8) {
              operator_delete(plStack_10608);
            }
            if (plStack_10628 != &lStack_10618) {
              operator_delete(plStack_10628);
            }
            if (plStack_10648 != &lStack_10638) {
              operator_delete(plStack_10648);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)bStack_10500._M_dataplus._M_p != &bStack_10500.field_2) {
              operator_delete(bStack_10500._M_dataplus._M_p);
            }
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,sStack_10698._M_dataplus._M_p,
                                sStack_10698._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," finished!",10);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"failed!",7);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
            poVar9 = (ostream *)&std::cout;
          }
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          if (uStack_106a8._0_1_ == true) {
            if ((void *)CONCAT44(aStack_106c8._12_4_,aStack_106c8._8_4_) != (void *)0x0) {
              operator_delete((void *)CONCAT44(aStack_106c8._12_4_,aStack_106c8._8_4_));
            }
            uStack_106a8 = uStack_106a8 & 0xffffff00;
          }
          if (paStack_10328 != (pointer)0x0) {
            operator_delete(paStack_10328);
          }
          if (ptStack_10350 != (pointer)0x0) {
            operator_delete(ptStack_10350);
          }
          std::
          vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
          ::~vector(&vStack_10378);
          Wave::~Wave(&WStack_10470);
          if (pdStack_10488 != (pointer)0x0) {
            operator_delete(pdStack_10488);
          }
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     *)auStack_104b0);
          if ((void *)auStack_104d0._8_8_ != (void *)0x0) {
            operator_delete((void *)auStack_104d0._8_8_);
          }
          std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::~vector
                    ((vector<Tile<Color>,_std::allocator<Tile<Color>_>_> *)auStack_104e0);
          bVar21 = iVar20 != 0;
          iVar20 = iVar20 + -1;
        } while ((bVar4 == false) && (bVar21));
        if (vStack_105c8.
            super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_105c8.
                          super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::~vector(&vStack_10518);
        std::vector<Tile<Color>,_std::allocator<Tile<Color>_>_>::~vector(&vStack_105a8);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&_Stack_10588);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tile<Color>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)auStack_10550);
        rapidxml::memory_pool<char>::clear(&mStack_10078);
        if (vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (char *)0x0) {
          operator_delete(vStack_10678.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        std::ifstream::~ifstream(asStack_10310);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_105e8._M_dataplus._M_p != &sStack_105e8.field_2) {
          operator_delete(sStack_105e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sStack_10698._M_dataplus._M_p != &sStack_10698.field_2) {
          operator_delete(sStack_10698._M_dataplus._M_p);
        }
        return;
      }
      goto LAB_0010bfb5;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0010bfb5:
  uVar15 = std::__throw_out_of_range("stoi");
  __clang_call_terminate(uVar15);
}

Assistant:

void read_simpletiled_instance(xml_node<> *node,
                               const string &current_dir) noexcept {
  string name = rapidxml::get_attribute(node, "name");
  string subset = rapidxml::get_attribute(node, "subset", "tiles");
  bool periodic_output =
      (rapidxml::get_attribute(node, "periodic", "False") == "True");
  unsigned width = stoi(rapidxml::get_attribute(node, "width", "48"));
  unsigned height = stoi(rapidxml::get_attribute(node, "height", "48"));

  cout << name << " " << subset << " started!" << endl;

  ifstream config_file("samples/" + name + "/data.xml");
  vector<char> buffer((istreambuf_iterator<char>(config_file)),
                      istreambuf_iterator<char>());
  buffer.push_back('\0');
  xml_document<> data_document;
  data_document.parse<0>(&buffer[0]);
  xml_node<> *data_root_node = data_document.first_node("set");
  unsigned size = stoi(rapidxml::get_attribute(data_root_node, "size"));

  unordered_map<string, Tile<Color>> tiles_map =
      read_tiles(data_root_node, current_dir + "/" + name, subset, size);
  unordered_map<string, unsigned> tiles_id;
  vector<Tile<Color>> tiles;
  unsigned id = 0;
  for (pair<string, Tile<Color>> tile : tiles_map) {
    tiles_id.insert({tile.first, id});
    tiles.push_back(tile.second);
    id++;
  }

  vector<tuple<string, unsigned, string, unsigned>> neighbors =
      read_neighbors(data_root_node);
  vector<tuple<unsigned, unsigned, unsigned, unsigned>> neighbors_ids;
  for (auto neighbor : neighbors) {
    const string &neighbor1 = get<0>(neighbor);
    const int &orientation1 = get<1>(neighbor);
    const string &neighbor2 = get<2>(neighbor);
    const int &orientation2 = get<3>(neighbor);
    if (tiles_id.find(neighbor1) == tiles_id.end()) {
      continue;
    }
    if (tiles_id.find(neighbor2) == tiles_id.end()) {
      continue;
    }
    neighbors_ids.push_back(make_tuple(tiles_id[neighbor1], orientation1,
                                       tiles_id[neighbor2], orientation2));
  }

  for (unsigned test = 0; test < 10; test++) {
    int seed = get_random_seed();
    TilingWFC<Color> wfc(tiles, neighbors_ids, height, width, {periodic_output},
                         seed);
    tl::optional<Array2D<Color>> success = wfc.run();
    if (success.has_value()) {
      write_image_png("results/" + name + "_" + subset + ".png", *success);
      cout << name << " finished!" << endl;
      break;
    } else {
      cout << "failed!" << endl;
    }
  }
}